

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_spv_func_and_recompile(CompilerMSL *this,SPVFuncImpl spv_func)

{
  size_type sVar1;
  SPVFuncImpl local_11;
  CompilerMSL *pCStack_10;
  SPVFuncImpl spv_func_local;
  CompilerMSL *this_local;
  
  local_11 = spv_func;
  pCStack_10 = this;
  sVar1 = ::std::
          set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
          ::count(&this->spv_function_implementations,&local_11);
  if (sVar1 == 0) {
    ::std::
    set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
    ::insert(&this->spv_function_implementations,&local_11);
    this->suppress_missing_prototypes = true;
    Compiler::force_recompile((Compiler *)this);
  }
  return;
}

Assistant:

void CompilerMSL::add_spv_func_and_recompile(SPVFuncImpl spv_func)
{
	if (spv_function_implementations.count(spv_func) == 0)
	{
		spv_function_implementations.insert(spv_func);
		suppress_missing_prototypes = true;
		force_recompile();
	}
}